

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O2

void re_goto_bottom(EditLine *el)

{
  terminal_move_to_line(el,(el->el_refresh).r_oldcv);
  terminal__putc(el,10);
  re_clear_display(el);
  terminal__flush(el);
  return;
}

Assistant:

libedit_private void
re_goto_bottom(EditLine *el)
{

	terminal_move_to_line(el, el->el_refresh.r_oldcv);
	terminal__putc(el, '\n');
	re_clear_display(el);
	terminal__flush(el);
}